

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O1

void uncover(DancingNode *targetDancingNode,
            vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
            *Matrix)

{
  int *piVar1;
  s_DancingNode *psVar2;
  pointer pvVar3;
  long lVar4;
  s_DancingNode *psVar5;
  s_DancingNode *psVar6;
  
  psVar2 = targetDancingNode->column;
  psVar5 = psVar2->up;
  if (psVar5 != psVar2) {
    pvVar3 = (Matrix->
             super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      psVar6 = psVar5->left;
      if (psVar6 != psVar5) {
        lVar4 = *(long *)&(pvVar3->super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>
                          )._M_impl.super__Vector_impl_data;
        do {
          psVar6->up->down = psVar6;
          psVar6->down->up = psVar6;
          piVar1 = (int *)(lVar4 + 0x30 + (long)psVar6->col * 0x38);
          *piVar1 = *piVar1 + 1;
          psVar6 = psVar6->left;
        } while (psVar6 != psVar5);
      }
      psVar5 = psVar5->up;
    } while (psVar5 != psVar2);
  }
  psVar2->left->right = psVar2;
  psVar2->right->left = psVar2;
  return;
}

Assistant:

void uncover(DancingNode *targetDancingNode, vector<vector<DancingNode>> &Matrix) 
{ 
    DancingNode *rowDancingNode, *leftDancingNode; 
  
    // get the pointer to the header of column 
    // to which this node belong  
    DancingNode *colDancingNode = targetDancingNode->column; 
  
    // Move down the column and link back 
    // each row by traversing left 
    for(rowDancingNode = colDancingNode->up; rowDancingNode != colDancingNode; rowDancingNode = rowDancingNode->up) 
    { 
        for(leftDancingNode = rowDancingNode->left; leftDancingNode != rowDancingNode; 
            leftDancingNode = leftDancingNode->left) 
        { 
            leftDancingNode->up->down = leftDancingNode; 
            leftDancingNode->down->up = leftDancingNode; 
  
            // after linking row node, increment the 
            // node count in column header 
            Matrix[0][leftDancingNode->col].nodeCount += 1; 
        } 
    } 
  
    // link the column header from it's neighbors 
    colDancingNode->left->right = colDancingNode; 
    colDancingNode->right->left = colDancingNode; 
}